

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

void __thiscall
matchit::impl::Id<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>::Id
          (Id<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *this,
          Id<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *id)

{
  undefined1 local_48 [8];
  _Variant_storage<false,_std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
  local_40;
  __index_type local_20;
  
  local_48 = (undefined1  [8])((ulong)local_48 & 0xffffffff00000000);
  local_40._M_u._M_rest._M_rest =
       (_Variadic_union<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
        )0x0;
  local_40._M_u._8_8_ = 0;
  local_40._M_u._16_8_ = 0;
  local_40._M_index = '\0';
  local_40._25_7_ = 0;
  std::
  variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*>
  ::
  variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,void,void,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,void>
            ((variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*>
              *)this,(IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *)
                     local_48);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
  ::~_Variant_storage(&local_40);
  local_48 = (undefined1  [8])block(id);
  local_20 = '\x01';
  std::__detail::__variant::
  _Move_assign_base<false,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
  ::operator=((_Move_assign_base<false,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
               *)this,(_Move_assign_base<false,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
                       *)local_48);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
                       *)local_48);
  return;
}

Assistant:

constexpr Id(Id const &id) { mBlock = BlockVT{&id.block()}; }